

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_test_util_test.cc
# Opt level: O2

void anon_unknown.dwarf_4654::Test_TemplateTestUtilTest_GetFilename::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  int iVar3;
  TemplateDictionary *pTVar4;
  char *pcVar5;
  TemplateDictionaryPeer child_peer;
  TemplateString local_e0;
  TemplateString local_c0;
  TemplateDictionaryPeer parent_peer;
  TemplateDictionary parent;
  
  ctemplate::TemplateString::TemplateString((TemplateString *)&parent_peer,"test_GetFilename");
  ctemplate::TemplateDictionary::TemplateDictionary
            (&parent,(TemplateString *)&parent_peer,(UnsafeArena *)0x0);
  ctemplate::TemplateString::TemplateString(&local_c0,"INCLUDE_marker");
  TVar1.length_ = local_c0.length_;
  TVar1.ptr_ = local_c0.ptr_;
  TVar1.is_immutable_ = local_c0.is_immutable_;
  TVar1._17_7_ = local_c0._17_7_;
  TVar1.id_ = local_c0.id_;
  pTVar4 = (TemplateDictionary *)ctemplate::TemplateDictionary::AddIncludeDictionary(TVar1);
  ctemplate::TemplateString::TemplateString(&local_e0,"included_filename");
  TVar2.length_ = local_e0.length_;
  TVar2.ptr_ = local_e0.ptr_;
  TVar2.is_immutable_ = local_e0.is_immutable_;
  TVar2._17_7_ = local_e0._17_7_;
  TVar2.id_ = local_e0.id_;
  ctemplate::TemplateDictionary::SetFilename(TVar2);
  parent_peer.dict_ = &parent;
  pcVar5 = ctemplate::TemplateDictionaryPeer::GetFilename(&parent_peer);
  if (pcVar5 == (char *)0x0) {
    child_peer.dict_ = pTVar4;
    pcVar5 = ctemplate::TemplateDictionaryPeer::GetFilename(&child_peer);
    iVar3 = strcmp("included_filename",pcVar5);
    if (iVar3 == 0) {
      ctemplate::TemplateDictionary::~TemplateDictionary(&parent);
      return;
    }
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(\"included_filename\", child_peer.GetFilename()) == 0");
  }
  else {
    fprintf(_stderr,"Check failed: %s %s %s\n","__null","==","parent_peer.GetFilename()");
  }
  exit(1);
}

Assistant:

TEST(TemplateTestUtilTest, GetFilename) {
  TemplateDictionary parent("test_GetFilename");
  TemplateDictionary* child = parent.AddIncludeDictionary("INCLUDE_marker");
  child->SetFilename("included_filename");

  TemplateDictionaryPeer parent_peer(&parent);
  EXPECT_EQ(NULL, parent_peer.GetFilename());

  TemplateDictionaryPeer child_peer(child);
  EXPECT_STREQ("included_filename", child_peer.GetFilename());
}